

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void aom_paeth_predictor_32x64_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [32];
  long in_RCX;
  __m256i *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m128i r1;
  __m128i r0;
  __m256i l16;
  __m256i rep;
  __m256i l;
  int j;
  int i;
  __m256i one;
  __m256i tl;
  __m256i t1;
  __m256i t0;
  undefined8 local_320;
  undefined8 uStackY_318;
  undefined8 local_310;
  undefined8 uStackY_308;
  __m256i *topleft;
  __m256i *top;
  __m256i *left_00;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  int local_288;
  int local_284;
  undefined8 uStack_270;
  undefined8 uStack_268;
  uint8_t local_240 [64];
  long local_200;
  __m256i *local_1f8;
  uint8_t *local_1f0;
  uint8_t *local_1e8;
  undefined1 local_1e0 [16];
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  __m256i *local_1c0;
  __m256i *palStack_1b8;
  __m256i *palStack_1b0;
  undefined8 uStack_1a8;
  undefined2 local_186;
  undefined2 local_184;
  ushort local_182;
  __m256i *local_180;
  __m256i *palStack_178;
  __m256i *palStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  uint8_t *local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  uint8_t *local_108;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  ushort local_e0;
  ushort local_de;
  ushort local_dc;
  ushort local_da;
  ushort local_d8;
  ushort local_d6;
  ushort local_d4;
  ushort local_d2;
  ushort local_d0;
  ushort local_ce;
  ushort local_cc;
  ushort local_ca;
  ushort local_c8;
  ushort local_c6;
  ushort local_c4;
  ushort local_c2;
  undefined1 local_c0 [32];
  undefined2 local_a0;
  undefined2 local_9e;
  undefined2 local_9c;
  undefined2 local_9a;
  undefined2 local_98;
  undefined2 local_96;
  undefined2 local_94;
  undefined2 local_92;
  undefined2 local_90;
  undefined2 local_8e;
  undefined2 local_8c;
  undefined2 local_8a;
  undefined2 local_88;
  undefined2 local_86;
  undefined2 local_84;
  undefined2 local_82;
  undefined1 local_80 [32];
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined2 local_48;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  
  local_200 = in_RCX;
  local_1f8 = in_RDX;
  local_1f0 = in_RSI;
  local_1e8 = in_RDI;
  get_top_vector(in_RDX,in_RSI);
  get_top_vector((__m256i *)(*local_1f8 + 2),in_RSI);
  local_182 = (ushort)*(byte *)((long)local_1f8[-1] + 0x1f);
  auVar3 = vpinsrw_avx(ZEXT216(local_182),(uint)local_182,1);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_182,2);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_182,3);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_182,4);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_182,5);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_182,6);
  local_100 = vpinsrw_avx(auVar3,(uint)local_182,7);
  auVar3 = vpinsrw_avx(ZEXT216(local_182),(uint)local_182,1);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_182,2);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_182,3);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_182,4);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_182,5);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_182,6);
  auStack_f0 = vpinsrw_avx(auVar3,(uint)local_182,7);
  local_184 = 1;
  local_82 = 1;
  local_84 = 1;
  local_86 = 1;
  local_88 = 1;
  local_8a = 1;
  local_8c = 1;
  local_8e = 1;
  local_90 = 1;
  local_92 = 1;
  local_94 = 1;
  local_96 = 1;
  local_98 = 1;
  local_9a = 1;
  local_9c = 1;
  local_9e = 1;
  local_a0 = 1;
  auVar3 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar3 = vpinsrw_avx(auVar3,1,2);
  auVar3 = vpinsrw_avx(auVar3,1,3);
  auVar3 = vpinsrw_avx(auVar3,1,4);
  auVar3 = vpinsrw_avx(auVar3,1,5);
  auVar3 = vpinsrw_avx(auVar3,1,6);
  auVar3 = vpinsrw_avx(auVar3,1,7);
  auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar2 = vpinsrw_avx(auVar2,1,2);
  auVar2 = vpinsrw_avx(auVar2,1,3);
  auVar2 = vpinsrw_avx(auVar2,1,4);
  auVar2 = vpinsrw_avx(auVar2,1,5);
  auVar2 = vpinsrw_avx(auVar2,1,6);
  auVar2 = vpinsrw_avx(auVar2,1,7);
  auVar4._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar4._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
  auVar5 = auVar4;
  local_e0 = local_182;
  local_de = local_182;
  local_dc = local_182;
  local_da = local_182;
  local_d8 = local_182;
  local_d6 = local_182;
  local_d4 = local_182;
  local_d2 = local_182;
  local_d0 = local_182;
  local_ce = local_182;
  local_cc = local_182;
  local_ca = local_182;
  local_c8 = local_182;
  local_c6 = local_182;
  local_c4 = local_182;
  local_c2 = local_182;
  local_c0 = auVar4;
  for (local_288 = 0; local_288 < 4; local_288 = local_288 + 1) {
    get_left_vector((__m256i *)(local_200 + (local_288 << 4)),in_RSI);
    local_186 = 0x8000;
    local_32 = 0x8000;
    local_34 = 0x8000;
    local_36 = 0x8000;
    local_38 = 0x8000;
    local_3a = 0x8000;
    local_3c = 0x8000;
    local_3e = 0x8000;
    local_40 = 0x8000;
    local_42 = 0x8000;
    local_44 = 0x8000;
    local_46 = 0x8000;
    local_48 = 0x8000;
    local_4a = 0x8000;
    local_4c = 0x8000;
    local_4e = 0x8000;
    local_50 = 0x8000;
    auVar3 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
    auVar3 = vpinsrw_avx(auVar3,0x8000,2);
    auVar3 = vpinsrw_avx(auVar3,0x8000,3);
    auVar3 = vpinsrw_avx(auVar3,0x8000,4);
    auVar3 = vpinsrw_avx(auVar3,0x8000,5);
    auVar3 = vpinsrw_avx(auVar3,0x8000,6);
    auVar3 = vpinsrw_avx(auVar3,0x8000,7);
    auVar2 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
    auVar2 = vpinsrw_avx(auVar2,0x8000,2);
    auVar2 = vpinsrw_avx(auVar2,0x8000,3);
    auVar2 = vpinsrw_avx(auVar2,0x8000,4);
    auVar2 = vpinsrw_avx(auVar2,0x8000,5);
    auVar2 = vpinsrw_avx(auVar2,0x8000,6);
    auVar2 = vpinsrw_avx(auVar2,0x8000,7);
    auVar6._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
    auVar6._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
    local_80 = auVar6;
    for (local_284 = 0; local_284 < 0x10; local_284 = local_284 + 1) {
      local_2c0 = auVar5._0_8_;
      uStack_2b8 = auVar5._8_8_;
      uStack_2b0 = auVar5._16_8_;
      uStack_2a8 = auVar5._24_8_;
      topleft = auVar6._0_8_;
      top = auVar6._8_8_;
      left_00 = auVar6._16_8_;
      uStack_2c8 = auVar6._24_8_;
      local_160 = local_2c0;
      uStack_158 = uStack_2b8;
      uStack_150 = uStack_2b0;
      uStack_148 = uStack_2a8;
      uStack_168 = uStack_2c8;
      auVar1 = vpshufb_avx2(auVar5,auVar6);
      auVar2 = auVar1._0_16_;
      local_180 = topleft;
      palStack_178 = top;
      palStack_170 = left_00;
      paeth_16x1_pred(left_00,top,topleft);
      in_RSI = local_240;
      auVar3 = auVar2;
      paeth_16x1_pred(left_00,top,topleft);
      local_108 = local_1e8;
      local_310 = auVar2._0_8_;
      local_120 = local_310;
      uStackY_308 = auVar2._8_8_;
      uStack_118 = uStackY_308;
      *(undefined8 *)local_1e8 = local_310;
      *(undefined8 *)(local_1e8 + 8) = uStackY_308;
      local_128 = local_1e8 + 0x10;
      local_320 = auVar3._0_8_;
      local_140 = local_320;
      uStackY_318 = auVar3._8_8_;
      uStack_138 = uStackY_318;
      *(undefined8 *)local_128 = local_320;
      *(undefined8 *)(local_1e8 + 0x18) = uStackY_318;
      local_1e8 = local_1f0 + (long)local_1e8;
      uStack_1a8 = uStack_2c8;
      uStack_270 = auVar4._16_8_;
      uStack_1d0 = uStack_270;
      uStack_268 = auVar4._24_8_;
      uStack_1c8 = uStack_268;
      auVar1._16_8_ = uStack_270;
      auVar1._0_16_ = auVar4._0_16_;
      auVar1._24_8_ = uStack_268;
      auVar6 = vpaddw_avx2(auVar6,auVar1);
      local_1c0 = topleft;
      palStack_1b8 = top;
      palStack_1b0 = left_00;
      local_1e0 = auVar4._0_16_;
    }
    auVar5 = auVar6;
  }
  return;
}

Assistant:

void aom_paeth_predictor_32x64_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m256i t0 = get_top_vector(above);
  const __m256i t1 = get_top_vector(above + 16);
  const __m256i tl = _mm256_set1_epi16((int16_t)above[-1]);
  const __m256i one = _mm256_set1_epi16(1);

  int i, j;
  for (j = 0; j < 4; ++j) {
    const __m256i l = get_left_vector(left + j * 16);
    __m256i rep = _mm256_set1_epi16((short)0x8000);
    for (i = 0; i < 16; ++i) {
      const __m256i l16 = _mm256_shuffle_epi8(l, rep);

      const __m128i r0 = paeth_16x1_pred(&l16, &t0, &tl);
      const __m128i r1 = paeth_16x1_pred(&l16, &t1, &tl);

      _mm_store_si128((__m128i *)dst, r0);
      _mm_store_si128((__m128i *)(dst + 16), r1);

      dst += stride;
      rep = _mm256_add_epi16(rep, one);
    }
  }
}